

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O0

void __thiscall Clasp::SharedMinimizeData::resetBounds(SharedMinimizeData *this)

{
  size_type sVar1;
  reference pLVar2;
  long __i;
  long in_RDI;
  WeightLiteral *t;
  weight_t x;
  weight_t end;
  weight_t wPos;
  WeightLiteral *lit;
  long *in_stack_ffffffffffffff80;
  long lVar3;
  __atomic_base<unsigned_int> *in_stack_ffffffffffffff88;
  size_type n;
  pod_vector<long,_std::allocator<long>_> *this_00;
  undefined8 in_stack_ffffffffffffff98;
  uint __n;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  long local_40;
  size_type local_34;
  size_type local_2c;
  long local_28;
  
  __n = (uint)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  std::__atomic_base<unsigned_int>::operator=
            (in_stack_ffffffffffffff88,(__int_type)((ulong)in_stack_ffffffffffffff80 >> 0x20));
  n = (size_type)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  *(undefined4 *)(in_RDI + 0x44) = 0;
  this_00 = *(pod_vector<long,_std::allocator<long>_> **)(in_RDI + 0x30);
  numRules((SharedMinimizeData *)0x1acf41);
  std::fill_n<std::atomic<long>*,unsigned_int,long>
            ((atomic<long> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),__n,
             (long *)this_00);
  numRules((SharedMinimizeData *)0x1acf71);
  maxBound();
  bk_lib::pod_vector<long,_std::allocator<long>_>::assign(this_00,n,in_stack_ffffffffffffff80);
  numRules((SharedMinimizeData *)0x1acfac);
  maxBound();
  bk_lib::pod_vector<long,_std::allocator<long>_>::assign(this_00,n,in_stack_ffffffffffffff80);
  local_28 = in_RDI + 0x68;
  local_2c = 0;
  sVar1 = bk_lib::
          pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
          ::size((pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
                  *)(in_RDI + 0x48));
  while (local_2c != sVar1) {
    local_34 = local_2c;
    while (pLVar2 = bk_lib::
                    pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
                    ::operator[]((pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
                                  *)(in_RDI + 0x48),local_34), *(int *)pLVar2 < 0) {
      local_34 = local_34 + 1;
      pLVar2 = bk_lib::
               pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
               ::operator[]((pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
                             *)(in_RDI + 0x48),local_34);
      if (pLVar2->weight < 0) {
        for (; *(size_type *)(local_28 + 4) != local_2c; local_28 = local_28 + 8) {
        }
        for (local_40 = local_28; *(size_type *)(local_40 + 4) == local_2c; local_40 = local_40 + 8)
        {
          pLVar2 = bk_lib::
                   pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
                   ::operator[]((pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
                                 *)(in_RDI + 0x48),local_34);
          __i = (long)pLVar2->weight;
          lVar3 = *(long *)(in_RDI + 0x30);
          pLVar2 = bk_lib::
                   pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
                   ::operator[]((pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
                                 *)(in_RDI + 0x48),local_34);
          std::__atomic_base<long>::operator+=
                    ((__atomic_base<long> *)(lVar3 + (ulong)(*(uint *)pLVar2 & 0x7fffffff) * 8),__i)
          ;
        }
      }
    }
    local_2c = local_34 + 1;
  }
  return;
}

Assistant:

void SharedMinimizeData::resetBounds() {
	gCount_  = 0;
	optGen_  = 0;
	std::fill_n(lower_, numRules(), wsum_t(0));
	up_[0].assign(numRules(), maxBound());
	up_[1].assign(numRules(), maxBound());
	const WeightLiteral* lit = lits;
	for (weight_t wPos = 0, end = (weight_t)weights.size(), x; wPos != end; wPos = x+1) {
		assert(weights[wPos].weight >= 0);
		for (x = wPos; weights[x].next; ) { // compound weight - check for negative
			if (weights[++x].weight < 0) {
				while (lit->second != wPos) { ++lit; }
				for (const WeightLiteral* t = lit; t->second == wPos; ++t) {
					lower_[weights[x].level] += weights[x].weight;
				}
			}
		}
	}
}